

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::SocketHandlerListening(CConnman *this,EventsPerSock *events_per_sock)

{
  pointer pLVar1;
  bool bVar2;
  const_iterator cVar3;
  pointer hListenSocket;
  long in_FS_OFFSET;
  key_type local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hListenSocket =
       (this->vhListenSocket).
       super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>._M_impl.
       super__Vector_impl_data._M_start;
  pLVar1 = (this->vhListenSocket).
           super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (hListenSocket != pLVar1) {
    do {
      bVar2 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
      if (bVar2) break;
      local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (hListenSocket->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (hListenSocket->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      cVar3 = std::
              _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&events_per_sock->_M_h,&local_48);
      if (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((cVar3.
           super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
           ._M_cur != (__node_type *)0x0) &&
         ((*(byte *)((long)cVar3.
                           super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                           ._M_cur + 0x19) & 1) != 0)) {
        AcceptConnection(this,hListenSocket);
      }
      hListenSocket = hListenSocket + 1;
    } while (hListenSocket != pLVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SocketHandlerListening(const Sock::EventsPerSock& events_per_sock)
{
    for (const ListenSocket& listen_socket : vhListenSocket) {
        if (interruptNet) {
            return;
        }
        const auto it = events_per_sock.find(listen_socket.sock);
        if (it != events_per_sock.end() && it->second.occurred & Sock::RECV) {
            AcceptConnection(listen_socket);
        }
    }
}